

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

void __thiscall CUIRect::VSplitLeft(CUIRect *this,float Cut,CUIRect *pLeft,CUIRect *pRight)

{
  long lVar1;
  undefined8 uVar2;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  CUIRect r;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = in_RDI[1];
  local_18 = (float)*in_RDI;
  fStack_14 = (float)((ulong)*in_RDI >> 0x20);
  fStack_c = (float)((ulong)uVar2 >> 0x20);
  if (in_RSI != (float *)0x0) {
    *in_RSI = local_18;
    in_RSI[1] = fStack_14;
    in_RSI[2] = in_XMM0_Da;
    in_RSI[3] = fStack_c;
  }
  if (in_RDX != (float *)0x0) {
    *in_RDX = local_18 + in_XMM0_Da;
    in_RDX[1] = fStack_14;
    local_10 = (float)uVar2;
    in_RDX[2] = local_10 - in_XMM0_Da;
    in_RDX[3] = fStack_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::VSplitLeft(float Cut, CUIRect *pLeft, CUIRect *pRight) const
{
	CUIRect r = *this;

	if(pLeft)
	{
		pLeft->x = r.x;
		pLeft->y = r.y;
		pLeft->w = Cut;
		pLeft->h = r.h;
	}

	if(pRight)
	{
		pRight->x = r.x + Cut;
		pRight->y = r.y;
		pRight->w = r.w - Cut;
		pRight->h = r.h;
	}
}